

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node48.cpp
# Opt level: O1

void duckdb::Node48::InsertChild(ART *art,Node *node,uint8_t byte,Node child)

{
  byte bVar1;
  ulong uVar2;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var3;
  type paVar4;
  long *plVar5;
  pointer this;
  data_ptr_t pdVar6;
  byte bVar7;
  ulong uVar8;
  long *plVar9;
  long lVar10;
  Node node48;
  IndexPointer local_38;
  
  uVar2 = (node->super_IndexPointer).data;
  paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(&art->allocators);
  _Var3._M_head_impl =
       paVar4->_M_elems[4].
       super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
       .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
  uVar8 = uVar2 & 0xffffffff;
  plVar5 = *(long **)(*(long *)&((_Var3._M_head_impl)->buffers)._M_h +
                     (uVar8 % *(size_type *)((long)&(_Var3._M_head_impl)->buffers + 8)) * 8);
  for (plVar9 = (long *)*plVar5; uVar8 != plVar9[1]; plVar9 = (long *)*plVar9) {
    plVar5 = plVar9;
  }
  this = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
         operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                     *)(*plVar5 + 0x10));
  pdVar6 = FixedSizeBuffer::Get(this,true);
  lVar10 = (ulong)((uint)(uVar2 >> 0x20) & 0xffffff) * (_Var3._M_head_impl)->segment_size;
  bVar1 = pdVar6[(_Var3._M_head_impl)->bitmask_offset + lVar10];
  if ((ulong)bVar1 == 0x30) {
    local_38.data = (node->super_IndexPointer).data;
    Node256::GrowNode48(art,node,(Node *)&local_38);
    Node256::InsertChild(art,node,byte,child);
  }
  else {
    pdVar6 = pdVar6 + (_Var3._M_head_impl)->bitmask_offset + lVar10;
    bVar7 = bVar1;
    if (pdVar6[(ulong)bVar1 * 8 + 0x10f] != '\0') {
      bVar7 = 0xff;
      do {
        bVar7 = bVar7 + 1;
      } while (0xffffffffffffff < *(ulong *)(pdVar6 + (ulong)bVar7 * 8 + 0x108));
    }
    ((IndexPointer *)(pdVar6 + (ulong)bVar7 * 8 + 0x108))->data =
         (idx_t)child.super_IndexPointer.data;
    pdVar6[(ulong)byte + 1] = bVar7;
    *pdVar6 = bVar1 + 1;
  }
  return;
}

Assistant:

void Node48::InsertChild(ART &art, Node &node, const uint8_t byte, const Node child) {
	auto &n48 = Node::Ref<Node48>(art, node, NODE_48);

	// The node is full. Grow to Node256.
	if (n48.count == CAPACITY) {
		auto node48 = node;
		Node256::GrowNode48(art, node, node48);
		Node256::InsertChild(art, node, byte, child);
		return;
	}

	// Still space. Insert the child.
	uint8_t child_pos = n48.count;
	if (n48.children[child_pos].HasMetadata()) {
		// Find an empty position in the node list.
		child_pos = 0;
		while (n48.children[child_pos].HasMetadata()) {
			child_pos++;
		}
	}

	n48.children[child_pos] = child;
	n48.child_index[byte] = child_pos;
	n48.count++;
}